

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

sexp_conflict sexp_load_standard_params(sexp_conflict ctx,sexp_conflict e,int nonblocking)

{
  sexp_conflict psVar1;
  sexp_conflict psVar2;
  int in_EDX;
  double in_RSI;
  sexp_conflict in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_conflict in_stack_ffffffffffffffb0;
  sexp_conflict in_stack_ffffffffffffffc0;
  sexp_conflict *local_30;
  sexp_conflict port;
  sexp_conflict psVar3;
  
  psVar3 = (sexp_conflict)&DAT_0000043e;
  memset(&local_30,0,0x10);
  local_30 = (sexp_conflict *)&stack0xffffffffffffffe0;
  port = (sexp_conflict)(in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&local_30;
  sexp_load_standard_ports(in_RDI,in_RSI,_stdin,_stdout,_stderr,0);
  if (in_EDX != 0) {
    psVar1 = in_RDI;
    sexp_param_ref(in_stack_ffffffffffffffc0,in_RDI,in_stack_ffffffffffffffb0);
    sexp_make_unblocking(psVar3,port);
    psVar2 = in_RDI;
    sexp_param_ref(in_RDI,psVar1,in_stack_ffffffffffffffb0);
    sexp_make_unblocking(psVar3,port);
    sexp_param_ref(psVar2,psVar1,in_stack_ffffffffffffffb0);
    sexp_make_unblocking(psVar3,port);
  }
  psVar1 = (sexp_conflict)sexp_make_env_op(in_RDI,0);
  (psVar1->value).flonum = in_RSI;
  (in_RDI->value).type.cpl = psVar1;
  psVar3 = in_RDI;
  psVar2 = sexp_meta_env(in_RDI);
  sexp_set_parameter(psVar3,psVar2,
                     (((in_RDI->value).type.setters)->value).context.mark_stack[4].start,psVar1);
  (in_RDI->value).context.saves = (sexp_gc_var_t *)port;
  return psVar1;
}

Assistant:

static sexp sexp_load_standard_params (sexp ctx, sexp e, int nonblocking) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  sexp_load_standard_ports(ctx, e, stdin, stdout, stderr, 0);
  if (nonblocking) {
    sexp_make_unblocking(ctx, sexp_param_ref(ctx, e, sexp_global(ctx, SEXP_G_CUR_IN_SYMBOL)));
    sexp_make_unblocking(ctx, sexp_param_ref(ctx, e, sexp_global(ctx, SEXP_G_CUR_OUT_SYMBOL)));
    sexp_make_unblocking(ctx, sexp_param_ref(ctx, e, sexp_global(ctx, SEXP_G_CUR_ERR_SYMBOL)));
  }
  res = sexp_make_env(ctx);
  sexp_env_parent(res) = e;
  sexp_context_env(ctx) = res;
  sexp_set_parameter(ctx, sexp_meta_env(ctx), sexp_global(ctx, SEXP_G_INTERACTION_ENV_SYMBOL), res);
  sexp_gc_release1(ctx);
  return res;
}